

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

time_t __thiscall QFileSystemModelPrivate::time(QFileSystemModelPrivate *this,time_t *__timer)

{
  bool bVar1;
  QFileSystemNode *pQVar2;
  QFileSystemNode *in_RDX;
  long in_FS_OFFSET;
  QFileSystemModelPrivate *this_00;
  QTimeZone local_20;
  QDateTime local_18 [8];
  QLocale local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  bVar1 = QModelIndex::isValid((QModelIndex *)this);
  if (bVar1) {
    QLocale::system();
    pQVar2 = node(this_00,(QModelIndex *)this);
    QTimeZone::QTimeZone((QTimeZone *)this,(Initialization)((ulong)pQVar2 >> 0x20));
    QFileSystemNode::lastModified(in_RDX,(QTimeZone *)__timer);
    QLocale::toString((QDateTime *)this,(FormatType)local_10);
    QDateTime::~QDateTime(local_18);
    QTimeZone::~QTimeZone(&local_20);
    QLocale::~QLocale(local_10);
  }
  else {
    QString::QString((QString *)0xaa58b4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (time_t)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModelPrivate::time(const QModelIndex &index) const
{
    if (!index.isValid())
        return QString();
#if QT_CONFIG(datestring)
    return QLocale::system().toString(node(index)->lastModified(QTimeZone::LocalTime), QLocale::ShortFormat);
#else
    Q_UNUSED(index);
    return QString();
#endif
}